

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::MergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Arena *arena;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar5;
  UnknownField value;
  UnknownField elem;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 local_48;
  undefined8 uStack_40;
  
  iVar2 = internal::SooRep::size
                    ((SooRep *)other,
                     (undefined1  [16])
                     ((undefined1  [16])(other->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
                     == (undefined1  [16])0x0);
  if (0 < iVar2) {
    iVar3 = internal::SooRep::size
                      ((SooRep *)this,
                       (undefined1  [16])
                       ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
                       == (undefined1  [16])0x0);
    RepeatedField<google::protobuf::UnknownField>::Reserve(&this->fields_,iVar2 + iVar3);
    if ((undefined1  [16])
        ((undefined1  [16])(other->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      paVar5 = &(other->fields_).soo_rep_.field_0.short_rep.field_1;
    }
    else {
      paVar5 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
               internal::LongSooRep::elements((LongSooRep *)other);
    }
    uVar1 = (other->fields_).soo_rep_.field_0.long_rep.elements_int;
    if ((uVar1 & 4) == 0) {
      pcVar4 = (char *)((long)&(other->fields_).soo_rep_.field_0 + 8);
    }
    else {
      pcVar4 = internal::LongSooRep::elements((LongSooRep *)other);
    }
    iVar2 = internal::SooRep::size((SooRep *)other,(uVar1 & 4) == 0);
    for (; paVar5 != (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)(pcVar4 + (long)iVar2 * 0x10);
        paVar5 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)(paVar5->data + 0x10)) {
      local_48 = *paVar5;
      uStack_40 = *(undefined8 *)(paVar5->data + 8);
      arena = UnknownFieldSet::arena(this);
      value = UnknownField::DeepCopy((UnknownField *)&local_48,arena);
      RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_,value);
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::MergeFrom(const UnknownFieldSet& other) {
  int other_field_count = other.field_count();
  if (other_field_count > 0) {
    fields_.Reserve(fields_.size() + other_field_count);
    for (auto elem : other.fields_) {
      fields_.Add(elem.DeepCopy(arena()));
    }
  }
}